

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O0

void gen_efdsub(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->spe_enabled ^ 0xffU) & 1) == 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    uVar1 = rA(ctx->opcode);
    gen_load_gpr64(tcg_ctx_00,t,uVar1);
    uVar1 = rB(ctx->opcode);
    gen_load_gpr64(tcg_ctx_00,t_00,uVar1);
    gen_helper_efdsub(tcg_ctx_00,t,tcg_ctx_00->cpu_env,t,t_00);
    uVar1 = rD(ctx->opcode);
    gen_store_gpr64(tcg_ctx_00,uVar1,t);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  else {
    gen_exception(ctx,0x20);
  }
  return;
}

Assistant:

static inline void gen_efdabs(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (unlikely(!ctx->spe_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_SPEU);
        return;
    }
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], cpu_gpr[rA(ctx->opcode)]);
    tcg_gen_andi_tl(tcg_ctx, cpu_gprh[rD(ctx->opcode)], cpu_gprh[rA(ctx->opcode)],
                    ~0x80000000);
}